

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder_utils.c
# Opt level: O1

Qiniu_Error
Qiniu_Utils_Generate_RecorderKey
          (char *uptoken,char *version,char *key,char *localFile,char **pRecorderKey)

{
  Qiniu_Bool QVar1;
  char *pcVar2;
  ulong uVar3;
  int *piVar4;
  Qiniu_Error QVar5;
  Qiniu_Recorder_Key_Generator recorderKeyGenerator;
  char *accessKey;
  char *bucket;
  char fullPath [4096];
  Qiniu_Recorder_Key_Generator local_1040;
  char *local_1038;
  char *local_1030;
  char local_1028 [4104];
  
  QVar1 = Qiniu_Utils_Extract_Bucket(uptoken,&local_1038,&local_1030);
  if (QVar1 == 0) {
    pcVar2 = "parse uptoken failed";
    uVar3 = 400;
  }
  else {
    pcVar2 = realpath(localFile,local_1028);
    if (pcVar2 == (char *)0x0) {
      piVar4 = __errno_location();
      uVar3 = (ulong)(uint)-*piVar4;
      pcVar2 = "realpath() error";
    }
    else {
      local_1040 = Qiniu_Recorder_Key_Generator_New();
      Qiniu_Recorder_Key_Generator_Append(&local_1040,version);
      Qiniu_Recorder_Key_Generator_Append(&local_1040,local_1038);
      Qiniu_Recorder_Key_Generator_Append(&local_1040,local_1030);
      Qiniu_Recorder_Key_Generator_Append(&local_1040,local_1028);
      if (key != (char *)0x0) {
        Qiniu_Recorder_Key_Generator_Append(&local_1040,key);
      }
      Qiniu_FreeV2(&local_1030);
      Qiniu_FreeV2(&local_1038);
      if (pRecorderKey != (char **)0x0) {
        pcVar2 = Qiniu_Recorder_Key_Generator_Generate(&local_1040);
        *pRecorderKey = pcVar2;
      }
      Qiniu_Recorder_Key_Generator_Free(local_1040);
      uVar3 = (ulong)(uint)Qiniu_OK.code;
      pcVar2 = Qiniu_OK.message;
    }
  }
  QVar5.message = pcVar2;
  QVar5._0_8_ = uVar3;
  return QVar5;
}

Assistant:

Qiniu_Error Qiniu_Utils_Generate_RecorderKey(const char *uptoken, const char *version, const char *key, const char *localFile, const char **pRecorderKey)
{
	char fullPath[PATH_MAX];
	const char *bucket, *accessKey;
	Qiniu_Error err;
	if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucket))
	{
		err.code = 400;
		err.message = "parse uptoken failed";
		return err;
	}
	if (_realpath(localFile, fullPath) == NULL)
	{
		err.code = -errno;
		err.message = "realpath() error";
		return err;
	}

	Qiniu_Recorder_Key_Generator recorderKeyGenerator = Qiniu_Recorder_Key_Generator_New();
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, version);
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, accessKey);
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, bucket);
	Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, fullPath);
	if (key != NULL)
	{
		Qiniu_Recorder_Key_Generator_Append(&recorderKeyGenerator, key);
	}

	Qiniu_FreeV2((void **)&bucket);
	Qiniu_FreeV2((void **)&accessKey);

	if (pRecorderKey != NULL)
	{
		*pRecorderKey = Qiniu_Recorder_Key_Generator_Generate(&recorderKeyGenerator);
	}
	Qiniu_Recorder_Key_Generator_Free(recorderKeyGenerator);
	return Qiniu_OK;
}